

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string_view pbrt::dequoteString(Token *t)

{
  string_view str_00;
  string_view s;
  string_view sVar1;
  bool bVar2;
  size_t *in_RDI;
  string_view str;
  size_t in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *in_stack_ffffffffffffff70;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_ffffffffffffffa8;
  FileLoc *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  str_00._M_str = in_stack_ffffffffffffff70;
  str_00._M_len = in_stack_ffffffffffffff68;
  bVar2 = isQuotedString(str_00);
  if (!bVar2) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI[1];
    s._M_str = in_stack_ffffffffffffffb8;
    s._M_len = (size_t)in_stack_ffffffffffffffb0;
    toString_abi_cxx11_(s);
    ErrorExit<std::__cxx11::string>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,args);
  }
  local_18._M_len = *in_RDI;
  local_18._M_str = (char *)in_RDI[1];
  this = &local_18;
  __n = 1;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(this,1);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix(this,__n);
  sVar1._M_str = local_18._M_str;
  sVar1._M_len = local_18._M_len;
  return sVar1;
}

Assistant:

static std::string_view dequoteString(const Token &t) {
    if (!isQuotedString(t.token))
        ErrorExit(&t.loc, "\"%s\": expected quoted string", toString(t.token));

    std::string_view str = t.token;
    str.remove_prefix(1);
    str.remove_suffix(1);
    return str;
}